

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Literal * __thiscall
wasm::TranslateToFuzzReader::tweak
          (Literal *__return_storage_ptr__,TranslateToFuzzReader *this,Literal *value)

{
  Type type;
  uint32_t uVar1;
  Random *this_00;
  Literal local_78;
  undefined1 local_60 [8];
  Literal RANGE_LITERAL;
  Literal adjustment;
  
  type.id = (value->type).id;
  if (type.id == 6) goto LAB_00144700;
  this_00 = &this->random;
  uVar1 = Random::upTo(this_00,5);
  if (uVar1 == 1) {
    wasm::Literal::makeOne((Type)&RANGE_LITERAL.type);
    wasm::Literal::add((Literal *)local_60);
    wasm::Literal::operator=(value,(Literal *)local_60);
LAB_001445ca:
    wasm::Literal::~Literal((Literal *)local_60);
    wasm::Literal::~Literal((Literal *)&RANGE_LITERAL.type);
  }
  else if (uVar1 == 0) {
    wasm::Literal::makeNegOne((Type)&RANGE_LITERAL.type);
    wasm::Literal::add((Literal *)local_60);
    wasm::Literal::operator=(value,(Literal *)local_60);
    goto LAB_001445ca;
  }
  if ((type.id & 0xfffffffffffffffe) == 4) {
    uVar1 = Random::upTo(this_00,2);
    if (uVar1 == 0) {
      Literal::makeFromInt32((Literal *)local_60,1000,type);
      uVar1 = Random::upTo(this_00,0x7d1);
      Literal::makeFromInt32((Literal *)&RANGE_LITERAL.type,uVar1,type);
      wasm::Literal::sub(&local_78);
      wasm::Literal::operator=((Literal *)&RANGE_LITERAL.type,&local_78);
      wasm::Literal::~Literal(&local_78);
      wasm::Literal::div(&local_78);
      wasm::Literal::operator=((Literal *)&RANGE_LITERAL.type,&local_78);
      wasm::Literal::~Literal(&local_78);
      wasm::Literal::add(&local_78);
      wasm::Literal::operator=(value,&local_78);
      wasm::Literal::~Literal(&local_78);
      wasm::Literal::~Literal((Literal *)&RANGE_LITERAL.type);
      wasm::Literal::~Literal((Literal *)local_60);
    }
  }
  uVar1 = Random::upTo(this_00,2);
  if (uVar1 == 0) {
    wasm::Literal::makeNegOne((Type)&RANGE_LITERAL.type);
    wasm::Literal::mul((Literal *)local_60);
    wasm::Literal::operator=(value,(Literal *)local_60);
    wasm::Literal::~Literal((Literal *)local_60);
    wasm::Literal::~Literal((Literal *)&RANGE_LITERAL.type);
  }
LAB_00144700:
  wasm::Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal TranslateToFuzzReader::tweak(Literal value) {
  auto type = value.type;
  if (type.isVector()) {
    // TODO: tweak each lane?
    return value;
  }
  // +- 1
  switch (upTo(5)) {
    case 0:
      value = value.add(Literal::makeNegOne(type));
      break;
    case 1:
      value = value.add(Literal::makeOne(type));
      break;
    default: {
    }
  }
  // For floats, optionally add a non-integer adjustment in +- [-1, 1]
  if (type.isFloat() && oneIn(2)) {
    const int RANGE = 1000;
    auto RANGE_LITERAL = Literal::makeFromInt32(RANGE, type);
    // adjustment -> [0, 2 * RANGE]
    auto adjustment = Literal::makeFromInt32(upTo(2 * RANGE + 1), type);
    // adjustment -> [-RANGE, RANGE]
    adjustment = adjustment.sub(RANGE_LITERAL);
    // adjustment -> [-1, 1]
    adjustment = adjustment.div(RANGE_LITERAL);
    value = value.add(adjustment);
  }
  // Flip sign.
  if (oneIn(2)) {
    value = value.mul(Literal::makeNegOne(type));
  }
  return value;
}